

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O3

void QIntC::range_check_error<unsigned_long_long>(unsigned_long_long *cur,unsigned_long_long *delta)

{
  ostream *poVar1;
  range_error *this;
  ostringstream msg;
  locale local_1c0 [8];
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  if ((*delta != 0) && (CARRY8(*delta,*cur))) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::locale::classic();
    std::ios::imbue(local_1c0);
    std::locale::~locale(local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"adding ",7);
    poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," to ",4);
    poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," would cause an integer overflow",0x20);
    this = (range_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::range_error::range_error(this,local_1b8);
    __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  return;
}

Assistant:

void
    range_check_error(T const& cur, T const& delta)
    {
        if ((delta > 0) && ((std::numeric_limits<T>::max() - cur) < delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer overflow";
            throw std::range_error(msg.str());
        } else if ((delta < 0) && ((std::numeric_limits<T>::min() - cur) > delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer underflow";
            throw std::range_error(msg.str());
        }
    }